

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyseCode.cpp
# Opt level: O0

uint immed_to_unsgned(string *is16,string *str)

{
  code *pcVar1;
  bool bVar2;
  ostream *poVar3;
  stringstream local_348 [8];
  stringstream ss_1;
  ostream local_338 [376];
  uint local_1c0 [2];
  int data_num_1;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  uint local_24;
  string *psStack_20;
  int data_num;
  string *str_local;
  string *is16_local;
  
  psStack_20 = str;
  str_local = is16;
  bVar2 = std::operator==(is16,"0X");
  if (bVar2) {
    local_24 = 0xffffffff;
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,std::hex);
    std::operator<<(poVar3,(string *)str);
    std::istream::operator>>((istream *)local_1b0,(int *)&local_24);
    is16_local._4_4_ = local_24;
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  else {
    bVar2 = std::operator==(is16,"");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_1c0[0] = 0xffffffff;
    std::__cxx11::stringstream::stringstream(local_348);
    std::operator<<(local_338,(string *)str);
    std::istream::operator>>((istream *)local_348,(int *)local_1c0);
    is16_local._4_4_ = local_1c0[0];
    std::__cxx11::stringstream::~stringstream(local_348);
  }
  return is16_local._4_4_;
}

Assistant:

unsigned immed_to_unsgned(std::string is16, std::string str){
	if (is16 == "0X") {//为16进制数
		int data_num{ -1 };
		std::stringstream ss;
		ss << std::hex << str;
		ss >> data_num;
		return (unsigned)data_num;
	}
	else if (is16 == "") {//10进制数
		int data_num{ -1 };
		std::stringstream ss;
		ss << str;
		ss >> data_num;
		return (unsigned)data_num;
	}
}